

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeCommandListDestroy(ze_command_list_handle_t hCommandList)

{
  _ze_command_list_handle_t *_key;
  ze_pfnCommandListDestroy_t pfnDestroy;
  dditable_t *dditable;
  ze_result_t result;
  ze_command_list_handle_t hCommandList_local;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x220) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_command_list_handle_t **)hCommandList;
    hCommandList_local._4_4_ = (**(code **)(*(long *)(hCommandList + 8) + 0x220))(_key);
    if (hCommandList_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_command_list_handle_t_*>,__ze_command_list_handle_t_*>::
      release(context,_key);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListDestroy(
        ze_command_list_handle_t hCommandList           ///< [in][release] handle of command list object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnDestroy = dditable->ze.CommandList.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // forward to device-driver
        result = pfnDestroy( hCommandList );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_command_list_factory.release( hCommandList );

        return result;
    }